

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

void checkformat(lua_State *L,char *form,char *flags,int precision)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  
  sVar4 = strspn(form + 1,flags);
  bVar1 = form[sVar4 + 1];
  uVar6 = 0x30;
  if (bVar1 != 0x30) {
    lVar2 = sVar4 + 1;
    if (bVar1 - 0x30 < 10) {
      lVar2 = sVar4 + 3;
      if (9 < (byte)form[sVar4 + 2] - 0x30) {
        lVar2 = sVar4 + 2;
      }
      bVar1 = form[(ulong)((byte)form[sVar4 + 2] - 0x30 < 10) + sVar4 + 2];
    }
    pcVar5 = form + lVar2;
    uVar6 = (uint)bVar1;
    if (((precision != 0) && (bVar1 == 0x2e)) &&
       (uVar6 = (uint)(byte)pcVar5[1], (byte)pcVar5[1] - 0x30 < 10)) {
      uVar6 = (uint)(byte)pcVar5[(ulong)((byte)pcVar5[2] - 0x30 < 10) + 2];
    }
  }
  iVar3 = isalpha(uVar6);
  if (iVar3 == 0) {
    luaL_error(L,"invalid conversion specification: \'%s\'",form);
    return;
  }
  return;
}

Assistant:

static void checkformat (lua_State *L, const char *form, const char *flags,
                                       int precision) {
  const char *spec = form + 1;  /* skip '%' */
  spec += strspn(spec, flags);  /* skip flags */
  if (*spec != '0') {  /* a width cannot start with '0' */
    spec = get2digits(spec);  /* skip width */
    if (*spec == '.' && precision) {
      spec++;
      spec = get2digits(spec);  /* skip precision */
    }
  }
  if (!isalpha(uchar(*spec)))  /* did not go to the end? */
    luaL_error(L, "invalid conversion specification: '%s'", form);
}